

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_get_txid(wally_tx *tx,uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  size_t is_elements;
  size_t local_20;
  
  local_20 = 0;
  iVar1 = wally_tx_is_elements(tx,&local_20);
  iVar2 = -2;
  if (iVar1 == 0) {
    iVar2 = tx_to_hex_or_txid(tx,(uint)(local_20 == 0) * 8 + 4,(char **)0x0,bytes_out,len,
                              local_20 != 0);
  }
  return iVar2;
}

Assistant:

int wally_tx_get_txid(const struct wally_tx *tx, unsigned char *bytes_out, size_t len)
{
    uint32_t flags = WALLY_TX_FLAG_ALLOW_PARTIAL;
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    if (!is_elements)
        flags |= WALLY_TX_FLAG_PRE_BIP144;
    return tx_to_hex_or_txid(tx, flags, NULL, bytes_out, len, is_elements);
}